

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O3

void __thiscall wasm_importtype_t::wasm_importtype_t(wasm_importtype_t *this,ImportType *it)

{
  pointer pcVar1;
  _Head_base<0UL,_wabt::interp::ExternType_*,_false> local_20;
  
  (this->I).module._M_dataplus._M_p = (pointer)&(this->I).module.field_2;
  pcVar1 = (it->module)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (it->module)._M_string_length);
  (this->I).name._M_dataplus._M_p = (pointer)&(this->I).name.field_2;
  pcVar1 = (it->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->I).name,pcVar1,pcVar1 + (it->name)._M_string_length);
  (*((it->type)._M_t.
     super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
     ._M_t.
     super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
     .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl)->_vptr_ExternType[2])
            (&(this->I).type);
  (*((it->type)._M_t.
     super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
     ._M_t.
     super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
     .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl)->_vptr_ExternType[2])
            (&local_20);
  wasm_externtype_t::New
            ((wasm_externtype_t *)&this->extern_,
             (unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_> *
             )&local_20);
  if (local_20._M_head_impl != (ExternType *)0x0) {
    (*(local_20._M_head_impl)->_vptr_ExternType[1])();
  }
  pcVar1 = (this->I).module._M_dataplus._M_p;
  (this->module).size = (this->I).module._M_string_length;
  (this->module).data = pcVar1;
  (this->name).size = (this->I).name._M_string_length;
  (this->name).data = (this->I).name._M_dataplus._M_p;
  return;
}

Assistant:

wasm_importtype_t(ImportType it)
      : I(it),
        extern_{wasm_externtype_t::New(it.type->Clone())},
        module{I.module.size(), const_cast<wasm_byte_t*>(I.module.data())},
        name{I.name.size(), const_cast<wasm_byte_t*>(I.name.data())} {}